

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O2

Status __thiscall util::fs::FileLock::acquire(FileLock *this,string *filename)

{
  string *psVar1;
  bool bVar2;
  int *piVar3;
  Status SVar4;
  undefined1 local_218 [8];
  ofstream touch;
  int aiStack_1f8 [120];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                 filename,".lock");
  std::__cxx11::string::operator=((string *)this,(string *)local_218);
  std::__cxx11::string::~string((string *)local_218);
  (this->reason)._M_string_length = 0;
  psVar1 = &this->reason;
  *(this->reason)._M_dataplus._M_p = '\0';
  bVar2 = file_exists((this->lockfile)._M_dataplus._M_p);
  if (bVar2) {
    std::__cxx11::string::assign((char *)psVar1);
    SVar4 = LOCK_EXISTS;
  }
  else {
    std::ofstream::ofstream(local_218,(this->lockfile)._M_dataplus._M_p,_S_bin);
    if (*(int *)((long)aiStack_1f8 + *(long *)((long)local_218 + -0x18)) == 0) {
      SVar4 = LOCK_CREATED;
      std::ofstream::close();
    }
    else {
      std::__cxx11::string::assign((char *)psVar1);
      piVar3 = __errno_location();
      strerror(*piVar3);
      std::__cxx11::string::append((char *)psVar1);
      SVar4 = LOCK_CREATE_ERROR;
    }
    std::ofstream::~ofstream(local_218);
  }
  return SVar4;
}

Assistant:

FileLock::Status
FileLock::acquire (std::string const& filename)
{
    /* Check if lock file exists. */
    this->lockfile = filename + ".lock";
    this->reason.clear();
    if (fs::file_exists(this->lockfile.c_str()))
    {
        this->reason = "Previous lock existing";
        return FileLock::LOCK_EXISTS;
    }

    /* Finally create the lock file. */
    std::ofstream touch(this->lockfile.c_str(), std::ios::binary);
    if (!touch.good())
    {
        this->reason = "Error locking: ";
        this->reason += std::strerror(errno);
        return FileLock::LOCK_CREATE_ERROR;
    }
    touch.close();

    /* Return success, lock is created. */
    return FileLock::LOCK_CREATED;
}